

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O2

int Cof_ObjLevel(Cof_Man_t *p,Cof_Obj_t *pObj)

{
  int iVar1;
  Gia_Man_t *p_00;
  Vec_Int_t *p_01;
  int iVar2;
  int i;
  int iVar3;
  Gia_Obj_t *pObj_00;
  long lVar4;
  int nCapMin;
  
  p_00 = p->pGia;
  pObj_00 = Gia_ManObj(p_00,pObj->Id);
  i = Gia_ObjId(p_00,pObj_00);
  p_01 = p_00->vLevels;
  iVar3 = p_01->nSize;
  if (iVar3 <= i) {
    iVar1 = i + 1;
    iVar2 = p_01->nCap * 2;
    nCapMin = iVar1;
    if ((iVar2 <= i) || (nCapMin = iVar2, p_01->nCap <= i)) {
      Vec_IntGrow(p_01,nCapMin);
      iVar3 = p_01->nSize;
    }
    for (lVar4 = (long)iVar3; lVar4 < iVar1; lVar4 = lVar4 + 1) {
      p_01->pArray[lVar4] = 0;
    }
    p_01->nSize = iVar1;
  }
  iVar3 = Vec_IntEntry(p_01,i);
  return iVar3;
}

Assistant:

static inline int         Cof_ObjLevel( Cof_Man_t * p, Cof_Obj_t * pObj )             { return Gia_ObjLevel(p->pGia, Gia_ManObj(p->pGia,pObj->Id)); }